

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O3

void DepParserTask::get_cost_to_go_losses
               (search *sch,v_array<std::pair<unsigned_int,_float>_> *gold_action_losses,
               uint32_t left_label,uint32_t right_label)

{
  void *pvVar1;
  int *piVar2;
  uint *puVar3;
  uint32_t uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint32_t i;
  float fVar12;
  pair<unsigned_int,_float> local_48;
  v_array<std::pair<unsigned_int,_float>_> *local_40;
  uint32_t local_38;
  uint32_t local_34;
  
  pvVar1 = sch->task_data;
  local_40 = gold_action_losses;
  local_38 = left_label;
  local_34 = right_label;
  v_array<std::pair<unsigned_int,_float>_>::clear(gold_action_losses);
  if (*(char *)((long)pvVar1 + 0x2c2) == '\0') {
    uVar7 = 1;
    do {
      puVar3 = *(uint **)((long)pvVar1 + 0x18);
      lVar6 = *(long *)((long)pvVar1 + 0x20) - (long)puVar3;
      if (lVar6 != 0) {
        uVar8 = lVar6 >> 2;
        if (uVar7 != *puVar3) {
          uVar11 = 1;
          do {
            uVar10 = uVar11;
            if (uVar8 + (uVar8 == 0) == uVar10) break;
            uVar11 = uVar10 + 1;
          } while (uVar7 != puVar3[uVar10]);
          if (uVar8 <= uVar10) goto LAB_0026f887;
        }
        local_48 = (pair<unsigned_int,_float>)
                   ((ulong)(uint)(float)*(uint *)(*(long *)((long)pvVar1 + 0x38) + uVar7 * 4) <<
                    0x20 | uVar7);
        v_array<std::pair<unsigned_int,_float>_>::push_back(local_40,&local_48);
      }
LAB_0026f887:
      uVar7 = uVar7 + 1;
    } while (uVar7 != 4);
    if (*(int *)((long)pvVar1 + 0x2c4) != 2) {
      return;
    }
    piVar2 = *(int **)((long)pvVar1 + 0x18);
    lVar6 = *(long *)((long)pvVar1 + 0x20) - (long)piVar2;
    if (lVar6 == 0) {
      return;
    }
    uVar7 = lVar6 >> 2;
    if (*piVar2 != 4) {
      uVar8 = 1;
      do {
        uVar11 = uVar8;
        if (uVar7 + (uVar7 == 0) == uVar11) break;
        uVar8 = uVar11 + 1;
      } while (piVar2[uVar11] != 4);
      if (uVar7 <= uVar11) {
        return;
      }
    }
    local_48 = (pair<unsigned_int,_float>)
               ((ulong)(uint)(float)*(uint *)(*(long *)((long)pvVar1 + 0x38) + 0x10) << 0x20 | 4);
    goto LAB_0026f8fc;
  }
  piVar2 = *(int **)((long)pvVar1 + 0x18);
  lVar6 = *(long *)((long)pvVar1 + 0x20) - (long)piVar2;
  if (lVar6 != 0) {
    uVar7 = lVar6 >> 2;
    if (*piVar2 != 1) {
      uVar8 = 1;
      do {
        uVar11 = uVar8;
        if (uVar7 + (uVar7 == 0) == uVar11) break;
        uVar8 = uVar11 + 1;
      } while (piVar2[uVar11] != 1);
      if (uVar7 <= uVar11) goto LAB_0026f6a5;
    }
    local_48 = (pair<unsigned_int,_float>)
               (((ulong)(uint)(float)*(uint *)(*(long *)((long)pvVar1 + 0x38) + 4) << 0x20) + 1);
    v_array<std::pair<unsigned_int,_float>_>::push_back(local_40,&local_48);
  }
LAB_0026f6a5:
  uVar7 = 2;
  do {
    puVar3 = *(uint **)((long)pvVar1 + 0x18);
    lVar6 = *(long *)((long)pvVar1 + 0x20) - (long)puVar3;
    if (lVar6 != 0) {
      uVar8 = lVar6 >> 2;
      if (uVar7 != *puVar3) {
        uVar11 = 1;
        do {
          uVar10 = uVar11;
          if (uVar8 + (uVar8 == 0) == uVar10) break;
          uVar11 = uVar10 + 1;
        } while (uVar7 != puVar3[uVar10]);
        if (uVar8 <= uVar10) goto LAB_0026f782;
      }
      uVar5 = *(uint *)((long)pvVar1 + 0x10);
      if (uVar5 != 0) {
        uVar4 = local_34;
        if (uVar7 == 3) {
          uVar4 = local_38;
        }
        uVar9 = 1;
        do {
          if ((*(int *)((long)pvVar1 + 0x2c4) == 2) ||
             (*(ulong *)((long)pvVar1 + 8) != (ulong)uVar9)) {
            fVar12 = 1.0;
            if (uVar9 == uVar4) {
              fVar12 = 0.0;
            }
            local_48.second = (float)*(uint *)(*(long *)((long)pvVar1 + 0x38) + uVar7 * 4) + fVar12;
            local_48.first = uVar5 * ((int)uVar7 + -2) + uVar9 + 1;
            v_array<std::pair<unsigned_int,_float>_>::push_back(local_40,&local_48);
            uVar5 = *(uint *)((long)pvVar1 + 0x10);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 <= uVar5);
      }
    }
LAB_0026f782:
    uVar7 = uVar7 + 1;
  } while (uVar7 != 4);
  if (*(int *)((long)pvVar1 + 0x2c4) != 2) {
    return;
  }
  piVar2 = *(int **)((long)pvVar1 + 0x18);
  lVar6 = *(long *)((long)pvVar1 + 0x20) - (long)piVar2;
  if (lVar6 == 0) {
    return;
  }
  uVar7 = lVar6 >> 2;
  if (*piVar2 != 4) {
    uVar8 = 1;
    do {
      uVar11 = uVar8;
      if (uVar7 + (uVar7 == 0) == uVar11) break;
      uVar8 = uVar11 + 1;
    } while (piVar2[uVar11] != 4);
    if (uVar7 <= uVar11) {
      return;
    }
  }
  local_48.second = (float)*(uint *)(*(long *)((long)pvVar1 + 0x38) + 0x10);
  local_48.first = *(int *)((long)pvVar1 + 0x10) * 2 + 2;
LAB_0026f8fc:
  v_array<std::pair<unsigned_int,_float>_>::push_back(local_40,&local_48);
  return;
}

Assistant:

void get_cost_to_go_losses(
    Search::search &sch, v_array<pair<action, float>> &gold_action_losses, uint32_t left_label, uint32_t right_label)
{
  task_data *data = sch.get_task_data<task_data>();
  bool &one_learner = data->one_learner;
  uint32_t &sys = data->transition_system;
  v_array<uint32_t> &action_loss = data->action_loss, &valid_actions = data->valid_actions;
  uint32_t &num_label = data->num_label;
  gold_action_losses.clear();

  if (one_learner)
  {
    if (is_valid(SHIFT, valid_actions))
      gold_action_losses.push_back(make_pair(SHIFT, (float)action_loss[SHIFT]));
    for (uint32_t i = 2; i <= 3; i++)
      if (is_valid(i, valid_actions))
      {
        for (uint32_t j = 1; j <= num_label; j++)
          if (sys == arc_eager || j != data->root_label)
            gold_action_losses.push_back(make_pair((1 + j + (i - 2) * num_label),
                action_loss[i] + (float)(j != (i == REDUCE_LEFT ? left_label : right_label))));
      }
    if (sys == arc_eager && is_valid(REDUCE, valid_actions))
      gold_action_losses.push_back(make_pair(2 + num_label * 2, (float)action_loss[REDUCE]));
  }
  else
  {
    for (action i = 1; i <= 3; i++)
      if (is_valid(i, valid_actions))
        gold_action_losses.push_back(make_pair(i, (float)action_loss[i]));
    if (sys == arc_eager && is_valid(REDUCE, valid_actions))
      gold_action_losses.push_back(make_pair(REDUCE, (float)action_loss[REDUCE]));
  }
}